

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O2

void Gia_ManEraHashResize(Gia_ManEra_t *p)

{
  uint uVar1;
  uint *__ptr;
  int iVar2;
  uint *puVar3;
  Gia_ObjEra_t *pState;
  int i;
  ulong uVar4;
  ulong uVar5;
  
  __ptr = p->pBins;
  if (__ptr == (uint *)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra.c"
                  ,0xea,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
  }
  uVar1 = p->nBins;
  iVar2 = Abc_PrimeCudd(uVar1 * 3);
  p->nBins = iVar2;
  puVar3 = (uint *)calloc((long)iVar2,4);
  p->pBins = puVar3;
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  iVar2 = 0;
LAB_005c7963:
  if (uVar5 == uVar4) {
    if (iVar2 != p->vStates->nSize + -1) {
      __assert_fail("Counter == Vec_PtrSize( p->vStates ) - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra.c"
                    ,0xff,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
    }
    free(__ptr);
    return;
  }
  if (__ptr[uVar5] == 0) goto LAB_005c7986;
  pState = Gia_ManEraState(p,__ptr[uVar5]);
  if (pState == (Gia_ObjEra_t *)0x0) goto LAB_005c7986;
  do {
    i = pState->iNext;
    while( true ) {
      if (pState == (Gia_ObjEra_t *)0x0) {
        uVar5 = uVar5 + 1;
        goto LAB_005c7963;
      }
      if (pState->Num == 0) {
        __assert_fail("pThis->Num",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra.c"
                      ,0xf8,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
      }
      pState->iNext = 0;
      puVar3 = Gia_ManEraHashFind(p,pState,(int *)0x0);
      if (*puVar3 != 0) {
        __assert_fail("*piPlace == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra.c"
                      ,0xfb,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
      }
      *puVar3 = pState->Num;
      if ((i != 0) && (pState = Gia_ManEraState(p,i), pState != (Gia_ObjEra_t *)0x0)) break;
      iVar2 = iVar2 + 1;
LAB_005c7986:
      pState = (Gia_ObjEra_t *)0x0;
      i = 0;
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void Gia_ManEraHashResize( Gia_ManEra_t * p )
{
    Gia_ObjEra_t * pThis;
    unsigned * pBinsOld, * piPlace;
    int nBinsOld, iNext, Counter, i;
    assert( p->pBins != NULL );
    // replace the table
    pBinsOld = p->pBins;
    nBinsOld = p->nBins;
    p->nBins = Abc_PrimeCudd( 3 * p->nBins ); 
    p->pBins = ABC_CALLOC( unsigned, p->nBins );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nBinsOld; i++ )
    for ( pThis = (pBinsOld[i]? Gia_ManEraState(p, pBinsOld[i]) : NULL),
          iNext = (pThis? pThis->iNext : 0);  
          pThis;  pThis = (iNext? Gia_ManEraState(p, iNext) : NULL),   
          iNext = (pThis? pThis->iNext : 0)  )
    {
        assert( pThis->Num );
        pThis->iNext = 0;
        piPlace = Gia_ManEraHashFind( p, pThis, NULL );
        assert( *piPlace == 0 ); // should not be there
        *piPlace = pThis->Num;
        Counter++;
    }
    assert( Counter == Vec_PtrSize( p->vStates ) - 1 );
    ABC_FREE( pBinsOld );
}